

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

void __thiscall cursespp::LayoutBase::GetFocus(LayoutBase *this)

{
  GetFocus(this);
  return;
}

Assistant:

IWindowPtr LayoutBase::GetFocus() {
    if (this->focused >= 0 && (int) this->focusable.size() > this->focused) {
        auto view = this->focusable[this->focused];
        if (view->IsVisible()) {
            /* see if the currently focused view is a layout. if it is, see if it
            has something focused. if it does, return that. if it doesn't, just
            return the view itself. this is confusing, but allows nested circular
            layouts to function automatically */
            LayoutBase* asLayoutBase = dynamic_cast<LayoutBase*>(view.get());
            if (asLayoutBase) {
                auto focused = asLayoutBase->GetFocus();
                if (focused) {
                    return focused;
                }
            }
            return view;
        }
    }

    return IWindowPtr();
}